

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  int i;
  wasm_extern_vec_t exports;
  wasm_val_t results [1];
  wasm_extern_t *imports [2];
  wasm_byte_vec_t binary;
  wasm_val_t args [2];
  undefined4 local_ac;
  long local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 local_88;
  uint local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  void *local_60;
  undefined1 local_58 [8];
  undefined4 local_50;
  undefined1 local_48;
  undefined4 local_40;
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  puts("Loading binary...");
  __stream = fopen("callback.wasm","r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar3 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_68,sVar3);
    sVar3 = fread(local_60,sVar3,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar4 = wasm_module_new(uVar2,local_68);
      if (lVar4 == 0) {
        pcVar10 = "> Error compiling module!";
      }
      else {
        local_98 = uVar1;
        wasm_byte_vec_delete(local_68);
        puts("Creating callback...");
        lVar5 = wasm_valtype_new(0);
        local_90 = lVar4;
        local_88 = wasm_valtype_new(0);
        local_a8 = lVar5;
        wasm_valtype_vec_new(local_58,1,&local_a8);
        wasm_valtype_vec_new(&local_78,1,&local_88);
        uVar1 = wasm_functype_new(local_58,&local_78);
        uVar6 = wasm_func_new(uVar2,uVar1,print_callback);
        local_ac = 0x2a;
        local_a8 = wasm_valtype_new(0);
        wasm_valtype_vec_new_empty(local_58);
        wasm_valtype_vec_new(&local_78,1,&local_a8);
        uVar7 = wasm_functype_new(local_58,&local_78);
        uVar8 = wasm_func_new_with_env(uVar2,uVar7,closure_callback,&local_ac,0);
        wasm_functype_delete(uVar1);
        lVar4 = local_90;
        wasm_functype_delete(uVar7);
        puts("Instantiating module...");
        local_78 = wasm_func_as_extern(uVar6);
        local_70 = wasm_func_as_extern(uVar8);
        lVar5 = wasm_instance_new(uVar2,lVar4,&local_78,0);
        if (lVar5 == 0) {
          pcVar10 = "> Error instantiating module!";
        }
        else {
          wasm_func_delete(uVar6);
          wasm_func_delete(uVar8);
          puts("Extracting export...");
          wasm_instance_exports(lVar5,&local_a8);
          if (local_a8 == 0) {
            pcVar10 = "> Error accessing exports!";
          }
          else {
            lVar9 = wasm_extern_as_func(*local_a0);
            if (lVar9 != 0) {
              wasm_module_delete(lVar4);
              wasm_instance_delete(lVar5);
              puts("Calling export...");
              local_58[0] = 0;
              local_50 = 3;
              local_48 = 0;
              local_40 = 4;
              lVar4 = wasm_func_call(lVar9,local_58,&local_88);
              if (lVar4 == 0) {
                wasm_extern_vec_delete(&local_a8);
                puts("Printing result...");
                printf("> %u\n",(ulong)local_80);
                puts("Shutting down...");
                wasm_store_delete(uVar2);
                wasm_engine_delete(local_98);
                pcVar10 = "Done.";
              }
              else {
                pcVar10 = "> Error calling function!";
              }
              puts(pcVar10);
              return (uint)(lVar4 != 0);
            }
            pcVar10 = "> Error accessing export!";
          }
        }
      }
      goto LAB_00101704;
    }
  }
  pcVar10 = "> Error loading module!";
LAB_00101704:
  puts(pcVar10);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("callback.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* print_type = wasm_functype_new_1_1(wasm_valtype_new_i32(), wasm_valtype_new_i32());
  own wasm_func_t* print_func = wasm_func_new(store, print_type, print_callback);

  int i = 42;
  own wasm_functype_t* closure_type = wasm_functype_new_0_1(wasm_valtype_new_i32());
  own wasm_func_t* closure_func = wasm_func_new_with_env(store, closure_type, closure_callback, &i, NULL);

  wasm_functype_delete(print_type);
  wasm_functype_delete(closure_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = {
    wasm_func_as_extern(print_func), wasm_func_as_extern(closure_func)
  };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(print_func);
  wasm_func_delete(closure_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  wasm_val_t args[2];
  args[0].kind = WASM_I32;
  args[0].of.i32 = 3;
  args[1].kind = WASM_I32;
  args[1].of.i32 = 4;
  wasm_val_t results[1];
  if (wasm_func_call(run_func, args, results)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Print result.
  printf("Printing result...\n");
  printf("> %u\n", results[0].of.i32);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}